

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_one_pass_cbr_svc_start_layer(AV1_COMP *cpi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  LAYER_CONTEXT *pLVar5;
  int iVar6;
  MB_MODE_INFO_EXT_FRAME *pMVar7;
  int iVar8;
  int iVar9;
  int height;
  int width;
  
  width = 0;
  height = 0;
  pLVar5 = (cpi->svc).layer_context;
  iVar6 = (cpi->svc).spatial_layer_id;
  iVar9 = (cpi->svc).temporal_layer_id;
  iVar4 = (cpi->svc).number_temporal_layers;
  iVar8 = iVar4 * iVar6 + iVar9;
  (cpi->svc).has_lower_quality_layer = 0;
  if (((0 < (long)iVar6) &&
      (iVar9 = (iVar6 + -1) * iVar4 + iVar9, pLVar5[iVar9].scaling_factor_den == 1)) &&
     (pLVar5[iVar9].scaling_factor_num == 1)) {
    (cpi->svc).has_lower_quality_layer = 1;
  }
  av1_get_layer_resolution
            ((cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
             pLVar5[iVar8].scaling_factor_num,pLVar5[iVar8].scaling_factor_den,&width,&height);
  if (height * width < 0x12c01) {
    (cpi->svc).downsample_filter_type[iVar6] = EIGHTTAP_SMOOTH;
  }
  (cpi->common).width = width;
  (cpi->common).height = height;
  iVar6 = av1_alloc_context_buffers
                    (&cpi->common,width,height,(cpi->sf).part_sf.default_min_partition_size);
  if (iVar6 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers")
    ;
  }
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [(cpi->common).mi_params.mi_alloc_bsize];
    iVar6 = (int)((bVar3 - 1) + (cpi->common).mi_params.mi_cols) / (int)(uint)bVar3;
    iVar9 = ((int)((cpi->common).mi_params.mi_rows + (bVar3 - 1)) / (int)(uint)bVar3) * iVar6;
    if ((cpi->mbmi_ext_info).alloc_size < iVar9) {
      aom_free((cpi->mbmi_ext_info).frame_base);
      (cpi->mbmi_ext_info).frame_base = (MB_MODE_INFO_EXT_FRAME *)0x0;
      (cpi->mbmi_ext_info).alloc_size = 0;
      pMVar7 = (MB_MODE_INFO_EXT_FRAME *)aom_malloc((long)iVar9 * 0x54);
      (cpi->mbmi_ext_info).frame_base = pMVar7;
      if (pMVar7 == (MB_MODE_INFO_EXT_FRAME *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mbmi_ext_info->frame_base");
      }
      (cpi->mbmi_ext_info).alloc_size = iVar9;
    }
    (cpi->mbmi_ext_info).stride = iVar6;
  }
  av1_update_frame_size(cpi);
  if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
    uVar1 = (cpi->common).mi_params.mi_rows;
    uVar2 = (cpi->common).mi_params.mi_cols;
    (cpi->svc).mi_cols_full_resoln = uVar2;
    (cpi->svc).mi_rows_full_resoln = uVar1;
  }
  return;
}

Assistant:

void av1_one_pass_cbr_svc_start_layer(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *lc = NULL;
  int width = 0, height = 0;
  lc = &svc->layer_context[svc->spatial_layer_id * svc->number_temporal_layers +
                           svc->temporal_layer_id];
  // Set the lower quality layer flag.
  svc->has_lower_quality_layer = 0;
  if (cpi->svc.spatial_layer_id > 0) {
    const LAYER_CONTEXT *lc_prev =
        &svc->layer_context[(svc->spatial_layer_id - 1) *
                                svc->number_temporal_layers +
                            svc->temporal_layer_id];
    if (lc_prev->scaling_factor_den == 1 && lc_prev->scaling_factor_num == 1)
      svc->has_lower_quality_layer = 1;
  }
  av1_get_layer_resolution(cpi->oxcf.frm_dim_cfg.width,
                           cpi->oxcf.frm_dim_cfg.height, lc->scaling_factor_num,
                           lc->scaling_factor_den, &width, &height);
  // Use Eightap_smooth for low resolutions.
  if (width * height <= 320 * 240)
    svc->downsample_filter_type[svc->spatial_layer_id] = EIGHTTAP_SMOOTH;

  cm->width = width;
  cm->height = height;
  alloc_mb_mode_info_buffers(cpi);
  av1_update_frame_size(cpi);
  if (svc->spatial_layer_id == svc->number_spatial_layers - 1) {
    svc->mi_cols_full_resoln = cm->mi_params.mi_cols;
    svc->mi_rows_full_resoln = cm->mi_params.mi_rows;
  }
}